

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draw.c
# Opt level: O3

IceTImage icetDrawFrame(IceTDouble *projection_matrix,IceTDouble *modelview_matrix,
                       IceTFloat *background_color)

{
  int *piVar1;
  double dVar2;
  double dVar3;
  byte bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [12];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  IceTBoolean IVar33;
  int iVar34;
  IceTSizeType IVar35;
  IceTSizeType IVar36;
  IceTEnum IVar37;
  IceTImage IVar38;
  IceTInt *pIVar39;
  ulong extraout_RAX;
  undefined7 extraout_var;
  ulong extraout_RAX_00;
  uint *contained_list;
  IceTBoolean *pIVar40;
  IceTDouble *pIVar41;
  IceTDouble *pIVar42;
  int *piVar43;
  IceTBoolean *sendbuf;
  IceTUByte *pIVar44;
  IceTFloat *pIVar45;
  float *pfVar46;
  int iVar47;
  int iVar48;
  ulong uVar49;
  uint uVar50;
  IceTInt value;
  uint uVar51;
  int iVar52;
  long lVar53;
  int iVar54;
  double dVar55;
  uint uVar56;
  ulong uVar57;
  uint uVar58;
  uint uVar59;
  IceTDouble *out;
  bool bVar60;
  double dVar61;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar62 [16];
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  long lVar73;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  float fVar77;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  double dVar82;
  undefined1 auVar83 [16];
  double dVar84;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  int iVar114;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  IceTInt num_tiles;
  IceTInt global_viewport [4];
  IceTInt frame_count;
  IceTInt num_bounding_verts;
  IceTDouble render_time;
  IceTDouble buf_read_time;
  IceTDouble total_time;
  IceTInt num_bounding_verts_1;
  IceTDouble tmp_matrix [16];
  uint local_384;
  uint local_380;
  uint local_37c;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined4 local_364;
  uint *local_360;
  double local_358;
  uint local_34c;
  undefined1 local_348 [24];
  float *local_330;
  double local_328;
  uint local_320;
  uint local_31c;
  undefined1 local_318 [16];
  int local_308;
  int iStack_304;
  undefined8 local_300;
  undefined1 local_2f8 [16];
  double local_2e8;
  double dStack_2e0;
  int local_2d0;
  int local_2cc;
  undefined8 local_2c8;
  IceTDouble local_248;
  IceTDouble local_240;
  IceTDouble local_238;
  undefined8 local_230;
  double local_1c8;
  double dStack_1c0;
  IceTDouble local_1b8 [16];
  double local_138 [6];
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  double local_d8;
  double dStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  int local_b8 [34];
  long lVar76;
  
  icetGetBooleanv(0x80,(IceTBoolean *)&local_2c8);
  if ((IceTBoolean)local_2c8 != '\0') {
    icetRaiseDiagnostic("Recursive frame draw detected.",0xfffffffb,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/draw.c"
                        ,0x30d);
    IVar38 = icetImageNull();
    return (IceTImage)IVar38.opaque_internals;
  }
  icetStateResetTiming();
  icetTimingDrawFrameBegin();
  icetStateSetDoublev(0x81,0x10,projection_matrix);
  icetStateSetDoublev(0x82,0x10,modelview_matrix);
  pIVar39 = icetUnsafeStateGetInteger(0x28);
  uVar51 = (uint)((float)*background_color * 255.0);
  uVar59 = (uint)((float)background_color[1] * 255.0);
  uVar50 = (uint)((float)background_color[2] * 255.0);
  uVar58 = (uint)((float)background_color[3] * 255.0);
  local_34c = uVar50;
  local_320 = uVar59;
  local_31c = uVar51;
  if (*pIVar39 == 0x302) {
    icetStateSetFloatv(5,4,black);
    icetStateSetInteger(6,0);
    icetGetIntegerv(0x1b,(IceTInt *)&local_2c8);
    uVar49 = extraout_RAX;
    if (((int)local_2c8 < 0) ||
       (uVar50 = (uVar59 & 0xff) << 8 | (local_34c & 0xff) << 0x10 | uVar58 << 0x18,
       uVar49 = (ulong)uVar50, (uVar51 & 0xff) == 0 && uVar50 == 0)) goto LAB_0010cf36;
    IVar33 = icetIsEnabled(0x143);
    uVar49 = CONCAT71(extraout_var,IVar33);
    if (IVar33 == '\0') goto LAB_0010cf36;
    local_364 = 0;
  }
  else {
    icetStateSetFloatv(5,4,background_color);
    icetStateSetInteger(6,uVar51 & 0xff |
                          (uVar59 & 0xff) << 8 | (uVar50 & 0xff) << 0x10 | uVar58 << 0x18);
    uVar49 = extraout_RAX_00;
LAB_0010cf36:
    local_364 = (undefined4)CONCAT71((int7)(uVar49 >> 8),1);
  }
  icetGetIntegerv(0x2e,&local_2d0);
  local_2d0 = local_2d0 + 1;
  icetStateSetIntegerv(0x2e,1,&local_2d0);
  icetGetIntegerv(0x23,&local_2cc);
  icetGetIntegerv(0x10,(IceTInt *)&local_37c);
  contained_list = (uint *)icetGetStateBuffer(0x181,local_37c << 2);
  pIVar40 = (IceTBoolean *)icetGetStateBuffer(0x182,local_37c);
  local_380 = uVar58;
  local_330 = (float *)background_color;
  if (local_2cc < 1) {
    if (0 < (int)local_37c) {
      lVar53 = 0;
      do {
        contained_list[lVar53] = (uint)lVar53;
        pIVar40[lVar53] = '\x01';
        lVar53 = lVar53 + 1;
      } while (lVar53 < (int)local_37c);
    }
    icetGetIntegerv(0x12,(IceTInt *)&local_378);
    local_248 = -1.0;
    local_1b8[0] = 1.0;
    local_384 = local_37c;
  }
  else {
    icetGetIntegerv(0x12,&local_308);
    icetGetDoublev(0x81,&local_248);
    icetGetDoublev(0x82,local_1b8);
    local_138[3] = 0.0;
    local_138[4] = 0.0;
    local_138[1] = 0.0;
    local_138[2] = 0.0;
    local_108 = 0;
    uStack_100 = 0;
    local_f8 = 0;
    uStack_f0 = 0;
    local_138[0] = (double)(int)local_300;
    local_138[5] = (double)(int)((ulong)local_300 >> 0x20);
    local_e8 = 0x4000000000000000;
    uStack_e0 = 0;
    local_d8 = (double)local_308 + (double)local_308 + local_138[0];
    dStack_d0 = (double)iStack_304 + (double)iStack_304 + local_138[5];
    local_c8 = 0;
    uStack_c0 = 0x4000000000000000;
    icetMatrixMultiply((IceTDouble *)local_b8,&local_248,local_1b8);
    icetMatrixMultiply((IceTDouble *)&local_2c8,(IceTDouble *)local_138,(IceTDouble *)local_b8);
    icetGetIntegerv(0x23,(IceTInt *)local_138);
    pIVar41 = (IceTDouble *)icetGetStateBuffer(0x180,local_138[0]._0_4_ << 5);
    pIVar42 = icetUnsafeStateGetDouble(0x22);
    if (0 < (int)local_138[0]._0_4_) {
      pIVar42 = pIVar42 + 2;
      lVar53 = 0;
      out = pIVar41;
      local_360 = contained_list;
      do {
        local_248 = pIVar42[-2];
        local_240 = pIVar42[-1];
        local_238 = *pIVar42;
        local_230 = 0x3ff0000000000000;
        icetMatrixVectorMultiply(out,(IceTDouble *)&local_2c8,&local_248);
        lVar53 = lVar53 + 1;
        out = out + 4;
        pIVar42 = pIVar42 + 3;
        contained_list = local_360;
      } while (lVar53 < (int)local_138[0]._0_4_);
    }
    background_color = (IceTFloat *)local_330;
    uVar58 = local_380;
    local_1c8 = (double)((int)local_300 + local_308);
    dStack_1c0 = (double)((int)((ulong)local_300 >> 0x20) + iStack_304);
    local_2e8 = (double)local_308;
    dStack_2e0 = (double)iStack_304;
    local_248 = 1.0;
    local_1b8[0] = -1.0;
    if ((int)local_138[0]._0_4_ < 1) {
      local_328 = 1.0;
      local_358 = -1.0;
      local_318._8_8_ = dStack_1c0;
      local_318._0_8_ = local_1c8;
      local_2f8._8_8_ = dStack_2e0;
      local_2f8._0_8_ = local_2e8;
    }
    else {
      uVar49 = 0;
      in_XMM11 = ZEXT816(0xbff0000000000000);
      local_328 = 1.0;
      local_318._8_8_ = dStack_1c0;
      local_318._0_8_ = local_1c8;
      local_2f8._8_8_ = dStack_2e0;
      local_2f8._0_8_ = local_2e8;
      do {
        dVar61 = (double)pIVar41[uVar49 * 4 + 2];
        dVar55 = (double)pIVar41[uVar49 * 4 + 3];
        if (0.0 <= dVar61 + dVar55) {
          dVar55 = 1.0 / dVar55;
          dVar61 = dVar61 * dVar55;
          if (dVar61 < local_328) {
            local_328 = dVar61;
            local_248 = (IceTDouble)dVar61;
          }
          auVar74._0_8_ = dVar55 * (double)pIVar41[uVar49 * 4];
          auVar74._8_8_ = dVar55 * (double)(pIVar41 + uVar49 * 4)[1];
          auVar63._8_8_ = auVar74._8_8_;
          auVar63._0_8_ = auVar74._0_8_;
          local_318 = minpd(auVar63,local_318);
          local_2f8 = maxpd(auVar74,local_2f8);
          if (in_XMM11._0_8_ < dVar61) {
            in_XMM11._8_8_ = 0;
            in_XMM11._0_8_ = dVar61;
            local_1b8[0] = (IceTDouble)dVar61;
          }
        }
        else {
          lVar53 = 0;
          do {
            dVar2 = *(double *)((long)pIVar41 + lVar53 + 0x10);
            dVar3 = *(double *)((long)pIVar41 + lVar53 + 0x18);
            dVar82 = dVar2 + dVar3;
            if (0.0 <= dVar82) {
              dVar82 = dVar82 / (((dVar2 - dVar61) + dVar3) - dVar55);
              dVar84 = 1.0 / ((dVar55 - dVar3) * dVar82 + dVar3);
              dVar2 = *(double *)((long)pIVar41 + lVar53);
              dVar3 = ((double *)((long)pIVar41 + lVar53))[1];
              auVar98._0_8_ = dVar84 * (dVar82 * ((double)pIVar41[uVar49 * 4] - dVar2) + dVar2);
              auVar98._8_8_ =
                   dVar84 * (dVar82 * ((double)(pIVar41 + uVar49 * 4)[1] - dVar3) + dVar3);
              auVar96._8_8_ = auVar98._8_8_;
              auVar96._0_8_ = auVar98._0_8_;
              local_318 = minpd(auVar96,local_318);
              local_2f8 = maxpd(auVar98,local_2f8);
              local_248 = -1.0;
              local_328 = -1.0;
            }
            lVar53 = lVar53 + 0x20;
          } while ((ulong)local_138[0]._0_4_ << 5 != lVar53);
        }
        uVar49 = uVar49 + 1;
      } while (uVar49 != local_138[0]._0_4_);
      if (local_328 < -1.0) {
        local_248 = -1.0;
        local_328 = -1.0;
      }
      local_358 = in_XMM11._0_8_;
      if (1.0 < local_358) {
        local_1b8[0] = 1.0;
        local_358 = 1.0;
      }
    }
    local_348._0_8_ = ceil(local_2f8._0_8_);
    auVar30._4_8_ = extraout_XMM0_Qb;
    auVar30._0_4_ = local_2f8._4_4_;
    auVar62._0_8_ = auVar30._0_8_ << 0x20;
    auVar62._8_4_ = local_2f8._8_4_;
    auVar62._12_4_ = local_2f8._12_4_;
    local_348._8_8_ = ceil(auVar62._8_8_);
    local_2f8._0_8_ = floor((double)local_318._0_8_);
    local_2f8._8_8_ = extraout_XMM0_Qb_00;
    dVar61 = floor((double)local_318._8_8_);
    auVar78._8_8_ = dVar61;
    auVar78._0_8_ = local_2f8._0_8_;
    auVar31._8_8_ = dStack_2e0;
    auVar31._0_8_ = local_2e8;
    auVar74 = maxpd(auVar31,auVar78);
    auVar32._8_8_ = dStack_1c0;
    auVar32._0_8_ = local_1c8;
    auVar63 = minpd(auVar32,local_348._0_16_);
    uStack_370 = CONCAT44((int)(auVar63._8_8_ - auVar74._8_8_),(int)(auVar63._0_8_ - auVar74._0_8_))
    ;
    local_378 = CONCAT44((int)auVar74._8_8_,(int)auVar74._0_8_);
    drawDetermineContainedTiles
              ((IceTInt *)&local_378,(IceTDouble)local_328,(IceTDouble)local_358,
               (IceTInt *)contained_list,pIVar40,(IceTInt *)&local_384);
  }
  icetGetIntegerv(2,(IceTInt *)local_138);
  icetGetIntegerv(3,local_b8);
  pIVar39 = icetUnsafeStateGetInteger(0x1a);
  icetGetIntegerv(0x2d,(IceTInt *)&local_2c8);
  if ((int)local_2c8 < 2) goto LAB_0010de41;
  piVar43 = (int *)icetGetStateBuffer(0x183,local_b8[0] << 2);
  icetGetIntegerv(0x2c,piVar43);
  uVar58 = local_384;
  uVar49 = (ulong)local_384;
  local_360 = contained_list;
  if ((int)local_2c8 < (int)local_384) {
    if (1 < (int)local_2c8) {
      iVar48 = 2;
      do {
        iVar54 = uStack_370._4_4_;
        iVar34 = iVar48;
        do {
          iVar48 = iVar34;
          iVar34 = iVar48 + 1;
        } while ((int)local_2c8 % iVar48 != 0);
        local_348._0_4_ = (int)uStack_370;
        lVar53 = (ulong)((int)uStack_370 < uStack_370._4_4_) * 4;
        iVar52 = *(int *)((long)&uStack_370 + (ulong)((int)uStack_370 < uStack_370._4_4_) * 4) /
                 iVar48;
        iVar34 = icetFindMyRankInGroup(piVar43,(int)local_2c8);
        local_2c8._0_4_ = (int)local_2c8 / iVar48;
        iVar34 = iVar34 / (int)local_2c8;
        iVar47 = iVar52 * iVar34;
        if (iVar34 + 2 == iVar48 + 1) {
          iVar52 = *(int *)((long)&uStack_370 + lVar53) - iVar47;
        }
        piVar43 = piVar43 + iVar34 * (int)local_2c8;
        *(int *)((long)&uStack_370 + lVar53) = iVar52;
        piVar1 = (int *)((long)&local_378 + (ulong)((int)local_348._0_4_ < iVar54) * 4);
        *piVar1 = *piVar1 + iVar47;
      } while (iVar48 <= (int)local_2c8);
    }
    contained_list = local_360;
    drawDetermineContainedTiles
              ((IceTInt *)&local_378,0.0,0.0,(IceTInt *)local_360,pIVar40,(IceTInt *)&local_384);
    background_color = (IceTFloat *)local_330;
    uVar58 = local_380;
    goto LAB_0010de41;
  }
  if ((int)local_384 < 1) {
    uVar50 = 0xffffffff;
LAB_0010d791:
    piVar43 = (int *)((long)&uStack_370 + 4);
    iVar54 = 0;
    local_384 = 0;
    local_378 = 0xffffd8f0ffffd8f0;
    uStack_370 = uStack_370 & 0xffffffff00000000;
  }
  else {
    local_348._0_8_ = (long)(int)local_384;
    uVar57 = 0;
    do {
      uVar51 = contained_list[uVar57];
      uVar59 = icetFindRankInGroup(piVar43,(int)local_2c8,pIVar39[(int)uVar51]);
      if (-1 < (int)uVar59) {
        bVar60 = piVar43[uVar59] == local_138[0]._0_4_;
        uVar56 = (uint)bVar60;
        uVar50 = 0xffffffff;
        if (bVar60) {
          uVar50 = uVar51;
        }
        iVar48 = -(uint)!bVar60;
        uVar58 = local_348._0_4_ - 1;
        contained_list[uVar57] = contained_list[local_348._0_8_ + -1];
        lVar53 = (long)(int)local_2c8;
        local_2c8._0_4_ = (int)local_2c8 + -1;
        piVar43[uVar59] = piVar43[lVar53 + -1];
        goto LAB_0010d6c0;
      }
      uVar57 = uVar57 + 1;
    } while (uVar49 != uVar57);
    uVar56 = 0;
    iVar48 = -1;
    uVar50 = 0xffffffff;
LAB_0010d6c0:
    if ((0 < (int)uVar58) && (0 < (long)(int)local_2c8)) {
      lVar53 = 0;
      iVar54 = 0;
      iVar34 = 0;
      do {
        bVar60 = (int)uVar58 <= iVar54;
        if ((int)uVar58 <= iVar54) {
          iVar54 = 0;
        }
        uVar56 = (uVar50 == contained_list[iVar54]) + uVar56;
        iVar47 = iVar34 + (uint)bVar60;
        iVar34 = iVar34 + (uint)bVar60;
        if (piVar43[lVar53] == local_138[0]._0_4_) {
          iVar48 = iVar34;
          uVar50 = contained_list[iVar54];
          uVar56 = iVar47 + 1;
        }
        lVar53 = lVar53 + 1;
        iVar54 = iVar54 + 1;
      } while ((int)local_2c8 != lVar53);
    }
    if ((int)uVar50 < 0) goto LAB_0010d791;
    pIVar39 = icetUnsafeStateGetInteger(0x11);
    uVar49 = (ulong)(uVar50 * 4);
    iVar54 = pIVar39[uVar49 + 2] / (int)uVar56;
    local_384 = 1;
    *local_360 = uVar50;
    uStack_370 = CONCAT44(pIVar39[uVar49 + 3],(int)uStack_370);
    local_378 = CONCAT44(pIVar39[uVar49 + 1],pIVar39[uVar49] + iVar54 * iVar48);
    if (iVar48 == uVar56 - 1) {
      iVar54 = pIVar39[uVar49 + 2] - iVar54 * iVar48;
    }
    piVar43 = (int *)&uStack_370;
  }
  *piVar43 = iVar54;
  icetGetIntegerv(0x10,&local_308);
  auVar63 = _DAT_0011c1f0;
  contained_list = local_360;
  background_color = (IceTFloat *)local_330;
  uVar58 = local_380;
  if (0 < (long)local_308) {
    dVar61 = (double)(ulong)uVar50;
    lVar53 = (long)local_308 + -1;
    local_348._8_4_ = (int)lVar53;
    local_348._0_8_ = lVar53;
    local_348._12_4_ = (int)((ulong)lVar53 >> 0x20);
    local_318._0_8_ = (long)dVar61 - 0xfU;
    local_358 = (double)((long)dVar61 - 0xe);
    local_328 = (double)((long)dVar61 - 0xd);
    local_2e8 = (double)((long)dVar61 - 0xc);
    dVar55 = 0.0;
    auVar74 = local_348._0_16_;
    auVar75 = _DAT_0011e010;
    auVar79 = _DAT_0011e020;
    auVar80 = _DAT_0011e030;
    auVar81 = _DAT_0011e040;
    auVar83 = _DAT_0011e050;
    auVar85 = _DAT_0011e060;
    auVar86 = _DAT_0011c6b0;
    auVar87 = _DAT_0011c1e0;
    do {
      auVar96 = local_348._0_16_ ^ auVar63;
      auVar98 = auVar87 ^ auVar63;
      iVar48 = auVar96._0_4_;
      iVar52 = -(uint)(iVar48 < auVar98._0_4_);
      iVar54 = auVar96._4_4_;
      auVar100._4_4_ = -(uint)(iVar54 < auVar98._4_4_);
      iVar34 = auVar96._8_4_;
      iVar114 = -(uint)(iVar34 < auVar98._8_4_);
      iVar47 = auVar96._12_4_;
      auVar100._12_4_ = -(uint)(iVar47 < auVar98._12_4_);
      auVar15._4_4_ = iVar52;
      auVar15._0_4_ = iVar52;
      auVar15._8_4_ = iVar114;
      auVar15._12_4_ = iVar114;
      auVar74 = pshuflw(auVar74,auVar15,0xe8);
      auVar99._4_4_ = -(uint)(auVar98._4_4_ == iVar54);
      auVar99._12_4_ = -(uint)(auVar98._12_4_ == iVar47);
      auVar99._0_4_ = auVar99._4_4_;
      auVar99._8_4_ = auVar99._12_4_;
      auVar98 = pshuflw(in_XMM11,auVar99,0xe8);
      auVar100._0_4_ = auVar100._4_4_;
      auVar100._8_4_ = auVar100._12_4_;
      auVar96 = pshuflw(auVar74,auVar100,0xe8);
      auVar64._8_4_ = 0xffffffff;
      auVar64._0_8_ = 0xffffffffffffffff;
      auVar64._12_4_ = 0xffffffff;
      auVar64 = (auVar96 | auVar98 & auVar74) ^ auVar64;
      auVar74 = packssdw(auVar64,auVar64);
      if ((auVar74 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pIVar40[(long)dVar55] = dVar61 == dVar55;
      }
      auVar16._4_4_ = iVar52;
      auVar16._0_4_ = iVar52;
      auVar16._8_4_ = iVar114;
      auVar16._12_4_ = iVar114;
      auVar100 = auVar99 & auVar16 | auVar100;
      auVar74 = packssdw(auVar100,auVar100);
      auVar5._8_4_ = 0xffffffff;
      auVar5._0_8_ = 0xffffffffffffffff;
      auVar5._12_4_ = 0xffffffff;
      auVar74 = packssdw(auVar74 ^ auVar5,auVar74 ^ auVar5);
      auVar74 = packsswb(auVar74,auVar74);
      if ((auVar74._0_4_ >> 8 & 1) != 0) {
        pIVar40[(long)dVar55 + 1] = (double)((long)dVar61 - 1U) == dVar55;
      }
      auVar74 = auVar86 ^ auVar63;
      auVar88._0_4_ = -(uint)(iVar48 < auVar74._0_4_);
      auVar88._4_4_ = -(uint)(iVar54 < auVar74._4_4_);
      auVar88._8_4_ = -(uint)(iVar34 < auVar74._8_4_);
      auVar88._12_4_ = -(uint)(iVar47 < auVar74._12_4_);
      auVar101._4_4_ = auVar88._0_4_;
      auVar101._0_4_ = auVar88._0_4_;
      auVar101._8_4_ = auVar88._8_4_;
      auVar101._12_4_ = auVar88._8_4_;
      iVar52 = -(uint)(auVar74._4_4_ == iVar54);
      iVar114 = -(uint)(auVar74._12_4_ == iVar47);
      auVar17._4_4_ = iVar52;
      auVar17._0_4_ = iVar52;
      auVar17._8_4_ = iVar114;
      auVar17._12_4_ = iVar114;
      auVar111._4_4_ = auVar88._4_4_;
      auVar111._0_4_ = auVar88._4_4_;
      auVar111._8_4_ = auVar88._12_4_;
      auVar111._12_4_ = auVar88._12_4_;
      auVar74 = auVar17 & auVar101 | auVar111;
      auVar74 = packssdw(auVar74,auVar74);
      auVar6._8_4_ = 0xffffffff;
      auVar6._0_8_ = 0xffffffffffffffff;
      auVar6._12_4_ = 0xffffffff;
      auVar74 = packssdw(auVar74 ^ auVar6,auVar74 ^ auVar6);
      auVar74 = packsswb(auVar74,auVar74);
      if ((auVar74._0_4_ >> 0x10 & 1) != 0) {
        pIVar40[(long)dVar55 + 2] = (double)((long)dVar61 - 2U) == dVar55;
      }
      auVar74 = pshufhw(auVar74,auVar101,0x84);
      auVar18._4_4_ = iVar52;
      auVar18._0_4_ = iVar52;
      auVar18._8_4_ = iVar114;
      auVar18._12_4_ = iVar114;
      auVar98 = pshufhw(auVar88,auVar18,0x84);
      auVar96 = pshufhw(auVar74,auVar111,0x84);
      auVar65._8_4_ = 0xffffffff;
      auVar65._0_8_ = 0xffffffffffffffff;
      auVar65._12_4_ = 0xffffffff;
      auVar65 = (auVar96 | auVar98 & auVar74) ^ auVar65;
      auVar74 = packssdw(auVar65,auVar65);
      auVar74 = packsswb(auVar74,auVar74);
      if ((auVar74._0_4_ >> 0x18 & 1) != 0) {
        pIVar40[(long)dVar55 + 3] = (double)((long)dVar61 - 3U) == dVar55;
      }
      auVar74 = auVar85 ^ auVar63;
      auVar89._0_4_ = -(uint)(iVar48 < auVar74._0_4_);
      auVar89._4_4_ = -(uint)(iVar54 < auVar74._4_4_);
      auVar89._8_4_ = -(uint)(iVar34 < auVar74._8_4_);
      auVar89._12_4_ = -(uint)(iVar47 < auVar74._12_4_);
      auVar19._4_4_ = auVar89._0_4_;
      auVar19._0_4_ = auVar89._0_4_;
      auVar19._8_4_ = auVar89._8_4_;
      auVar19._12_4_ = auVar89._8_4_;
      auVar98 = pshuflw(auVar111,auVar19,0xe8);
      auVar66._0_4_ = -(uint)(auVar74._0_4_ == iVar48);
      auVar66._4_4_ = -(uint)(auVar74._4_4_ == iVar54);
      auVar66._8_4_ = -(uint)(auVar74._8_4_ == iVar34);
      auVar66._12_4_ = -(uint)(auVar74._12_4_ == iVar47);
      auVar102._4_4_ = auVar66._4_4_;
      auVar102._0_4_ = auVar66._4_4_;
      auVar102._8_4_ = auVar66._12_4_;
      auVar102._12_4_ = auVar66._12_4_;
      auVar74 = pshuflw(auVar66,auVar102,0xe8);
      auVar103._4_4_ = auVar89._4_4_;
      auVar103._0_4_ = auVar89._4_4_;
      auVar103._8_4_ = auVar89._12_4_;
      auVar103._12_4_ = auVar89._12_4_;
      auVar96 = pshuflw(auVar89,auVar103,0xe8);
      auVar7._8_4_ = 0xffffffff;
      auVar7._0_8_ = 0xffffffffffffffff;
      auVar7._12_4_ = 0xffffffff;
      auVar74 = packssdw(auVar74 & auVar98,(auVar96 | auVar74 & auVar98) ^ auVar7);
      auVar74 = packsswb(auVar74,auVar74);
      if ((auVar74 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        pIVar40[(long)dVar55 + 4] = (double)((long)dVar61 - 4U) == dVar55;
      }
      auVar20._4_4_ = auVar89._0_4_;
      auVar20._0_4_ = auVar89._0_4_;
      auVar20._8_4_ = auVar89._8_4_;
      auVar20._12_4_ = auVar89._8_4_;
      auVar103 = auVar102 & auVar20 | auVar103;
      auVar96 = packssdw(auVar103,auVar103);
      auVar8._8_4_ = 0xffffffff;
      auVar8._0_8_ = 0xffffffffffffffff;
      auVar8._12_4_ = 0xffffffff;
      auVar74 = packssdw(auVar74,auVar96 ^ auVar8);
      auVar74 = packsswb(auVar74,auVar74);
      if ((auVar74._4_2_ >> 8 & 1) != 0) {
        pIVar40[(long)dVar55 + 5] = (double)((long)dVar61 - 5U) == dVar55;
      }
      auVar74 = auVar83 ^ auVar63;
      auVar90._0_4_ = -(uint)(iVar48 < auVar74._0_4_);
      auVar90._4_4_ = -(uint)(iVar54 < auVar74._4_4_);
      auVar90._8_4_ = -(uint)(iVar34 < auVar74._8_4_);
      auVar90._12_4_ = -(uint)(iVar47 < auVar74._12_4_);
      auVar104._4_4_ = auVar90._0_4_;
      auVar104._0_4_ = auVar90._0_4_;
      auVar104._8_4_ = auVar90._8_4_;
      auVar104._12_4_ = auVar90._8_4_;
      iVar52 = -(uint)(auVar74._4_4_ == iVar54);
      iVar114 = -(uint)(auVar74._12_4_ == iVar47);
      auVar21._4_4_ = iVar52;
      auVar21._0_4_ = iVar52;
      auVar21._8_4_ = iVar114;
      auVar21._12_4_ = iVar114;
      auVar112._4_4_ = auVar90._4_4_;
      auVar112._0_4_ = auVar90._4_4_;
      auVar112._8_4_ = auVar90._12_4_;
      auVar112._12_4_ = auVar90._12_4_;
      auVar74 = auVar21 & auVar104 | auVar112;
      auVar74 = packssdw(auVar74,auVar74);
      auVar9._8_4_ = 0xffffffff;
      auVar9._0_8_ = 0xffffffffffffffff;
      auVar9._12_4_ = 0xffffffff;
      auVar74 = packssdw(auVar74 ^ auVar9,auVar74 ^ auVar9);
      auVar74 = packsswb(auVar74,auVar74);
      if ((auVar74 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        pIVar40[(long)dVar55 + 6] = (double)((long)dVar61 - 6U) == dVar55;
      }
      auVar74 = pshufhw(auVar74,auVar104,0x84);
      auVar22._4_4_ = iVar52;
      auVar22._0_4_ = iVar52;
      auVar22._8_4_ = iVar114;
      auVar22._12_4_ = iVar114;
      auVar98 = pshufhw(auVar90,auVar22,0x84);
      auVar96 = pshufhw(auVar74,auVar112,0x84);
      auVar67._8_4_ = 0xffffffff;
      auVar67._0_8_ = 0xffffffffffffffff;
      auVar67._12_4_ = 0xffffffff;
      auVar67 = (auVar96 | auVar98 & auVar74) ^ auVar67;
      auVar74 = packssdw(auVar67,auVar67);
      auVar74 = packsswb(auVar74,auVar74);
      if ((auVar74._6_2_ >> 8 & 1) != 0) {
        pIVar40[(long)dVar55 + 7] = (double)((long)dVar61 - 7U) == dVar55;
      }
      auVar74 = auVar81 ^ auVar63;
      auVar91._0_4_ = -(uint)(iVar48 < auVar74._0_4_);
      auVar91._4_4_ = -(uint)(iVar54 < auVar74._4_4_);
      auVar91._8_4_ = -(uint)(iVar34 < auVar74._8_4_);
      auVar91._12_4_ = -(uint)(iVar47 < auVar74._12_4_);
      auVar23._4_4_ = auVar91._0_4_;
      auVar23._0_4_ = auVar91._0_4_;
      auVar23._8_4_ = auVar91._8_4_;
      auVar23._12_4_ = auVar91._8_4_;
      auVar98 = pshuflw(auVar112,auVar23,0xe8);
      auVar68._0_4_ = -(uint)(auVar74._0_4_ == iVar48);
      auVar68._4_4_ = -(uint)(auVar74._4_4_ == iVar54);
      auVar68._8_4_ = -(uint)(auVar74._8_4_ == iVar34);
      auVar68._12_4_ = -(uint)(auVar74._12_4_ == iVar47);
      auVar105._4_4_ = auVar68._4_4_;
      auVar105._0_4_ = auVar68._4_4_;
      auVar105._8_4_ = auVar68._12_4_;
      auVar105._12_4_ = auVar68._12_4_;
      auVar74 = pshuflw(auVar68,auVar105,0xe8);
      auVar106._4_4_ = auVar91._4_4_;
      auVar106._0_4_ = auVar91._4_4_;
      auVar106._8_4_ = auVar91._12_4_;
      auVar106._12_4_ = auVar91._12_4_;
      auVar96 = pshuflw(auVar91,auVar106,0xe8);
      auVar92._8_4_ = 0xffffffff;
      auVar92._0_8_ = 0xffffffffffffffff;
      auVar92._12_4_ = 0xffffffff;
      auVar92 = (auVar96 | auVar74 & auVar98) ^ auVar92;
      auVar96 = packssdw(auVar92,auVar92);
      auVar74 = packsswb(auVar74 & auVar98,auVar96);
      if ((auVar74 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pIVar40[(long)dVar55 + 8] = (double)((long)dVar61 - 8U) == dVar55;
      }
      auVar24._4_4_ = auVar91._0_4_;
      auVar24._0_4_ = auVar91._0_4_;
      auVar24._8_4_ = auVar91._8_4_;
      auVar24._12_4_ = auVar91._8_4_;
      auVar106 = auVar105 & auVar24 | auVar106;
      auVar96 = packssdw(auVar106,auVar106);
      auVar10._8_4_ = 0xffffffff;
      auVar10._0_8_ = 0xffffffffffffffff;
      auVar10._12_4_ = 0xffffffff;
      auVar96 = packssdw(auVar96 ^ auVar10,auVar96 ^ auVar10);
      auVar74 = packsswb(auVar74,auVar96);
      if ((auVar74._8_2_ >> 8 & 1) != 0) {
        pIVar40[(long)dVar55 + 9] = (double)((long)dVar61 - 9U) == dVar55;
      }
      auVar74 = auVar80 ^ auVar63;
      auVar93._0_4_ = -(uint)(iVar48 < auVar74._0_4_);
      auVar93._4_4_ = -(uint)(iVar54 < auVar74._4_4_);
      auVar93._8_4_ = -(uint)(iVar34 < auVar74._8_4_);
      auVar93._12_4_ = -(uint)(iVar47 < auVar74._12_4_);
      auVar107._4_4_ = auVar93._0_4_;
      auVar107._0_4_ = auVar93._0_4_;
      auVar107._8_4_ = auVar93._8_4_;
      auVar107._12_4_ = auVar93._8_4_;
      iVar52 = -(uint)(auVar74._4_4_ == iVar54);
      iVar114 = -(uint)(auVar74._12_4_ == iVar47);
      auVar25._4_4_ = iVar52;
      auVar25._0_4_ = iVar52;
      auVar25._8_4_ = iVar114;
      auVar25._12_4_ = iVar114;
      auVar113._4_4_ = auVar93._4_4_;
      auVar113._0_4_ = auVar93._4_4_;
      auVar113._8_4_ = auVar93._12_4_;
      auVar113._12_4_ = auVar93._12_4_;
      auVar74 = auVar25 & auVar107 | auVar113;
      auVar74 = packssdw(auVar74,auVar74);
      auVar11._8_4_ = 0xffffffff;
      auVar11._0_8_ = 0xffffffffffffffff;
      auVar11._12_4_ = 0xffffffff;
      auVar74 = packssdw(auVar74 ^ auVar11,auVar74 ^ auVar11);
      auVar74 = packsswb(auVar74,auVar74);
      if ((auVar74 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        pIVar40[(long)dVar55 + 10] = (double)((long)dVar61 - 10U) == dVar55;
      }
      auVar74 = pshufhw(auVar74,auVar107,0x84);
      auVar26._4_4_ = iVar52;
      auVar26._0_4_ = iVar52;
      auVar26._8_4_ = iVar114;
      auVar26._12_4_ = iVar114;
      auVar98 = pshufhw(auVar93,auVar26,0x84);
      auVar96 = pshufhw(auVar74,auVar113,0x84);
      auVar69._8_4_ = 0xffffffff;
      auVar69._0_8_ = 0xffffffffffffffff;
      auVar69._12_4_ = 0xffffffff;
      auVar69 = (auVar96 | auVar98 & auVar74) ^ auVar69;
      auVar74 = packssdw(auVar69,auVar69);
      auVar74 = packsswb(auVar74,auVar74);
      if ((auVar74._10_2_ >> 8 & 1) != 0) {
        pIVar40[(long)dVar55 + 0xb] = (double)((long)dVar61 - 0xbU) == dVar55;
      }
      auVar74 = auVar79 ^ auVar63;
      auVar94._0_4_ = -(uint)(iVar48 < auVar74._0_4_);
      auVar94._4_4_ = -(uint)(iVar54 < auVar74._4_4_);
      auVar94._8_4_ = -(uint)(iVar34 < auVar74._8_4_);
      auVar94._12_4_ = -(uint)(iVar47 < auVar74._12_4_);
      auVar27._4_4_ = auVar94._0_4_;
      auVar27._0_4_ = auVar94._0_4_;
      auVar27._8_4_ = auVar94._8_4_;
      auVar27._12_4_ = auVar94._8_4_;
      auVar98 = pshuflw(auVar113,auVar27,0xe8);
      auVar70._0_4_ = -(uint)(auVar74._0_4_ == iVar48);
      auVar70._4_4_ = -(uint)(auVar74._4_4_ == iVar54);
      auVar70._8_4_ = -(uint)(auVar74._8_4_ == iVar34);
      auVar70._12_4_ = -(uint)(auVar74._12_4_ == iVar47);
      auVar108._4_4_ = auVar70._4_4_;
      auVar108._0_4_ = auVar70._4_4_;
      auVar108._8_4_ = auVar70._12_4_;
      auVar108._12_4_ = auVar70._12_4_;
      auVar74 = pshuflw(auVar70,auVar108,0xe8);
      auVar109._4_4_ = auVar94._4_4_;
      auVar109._0_4_ = auVar94._4_4_;
      auVar109._8_4_ = auVar94._12_4_;
      auVar109._12_4_ = auVar94._12_4_;
      auVar96 = pshuflw(auVar94,auVar109,0xe8);
      auVar12._8_4_ = 0xffffffff;
      auVar12._0_8_ = 0xffffffffffffffff;
      auVar12._12_4_ = 0xffffffff;
      auVar74 = packssdw(auVar74 & auVar98,(auVar96 | auVar74 & auVar98) ^ auVar12);
      auVar74 = packsswb(auVar74,auVar74);
      if ((auVar74 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        pIVar40[(long)dVar55 + 0xc] = local_2e8 == dVar55;
      }
      auVar28._4_4_ = auVar94._0_4_;
      auVar28._0_4_ = auVar94._0_4_;
      auVar28._8_4_ = auVar94._8_4_;
      auVar28._12_4_ = auVar94._8_4_;
      auVar109 = auVar108 & auVar28 | auVar109;
      auVar96 = packssdw(auVar109,auVar109);
      auVar13._8_4_ = 0xffffffff;
      auVar13._0_8_ = 0xffffffffffffffff;
      auVar13._12_4_ = 0xffffffff;
      auVar74 = packssdw(auVar74,auVar96 ^ auVar13);
      auVar74 = packsswb(auVar74,auVar74);
      if ((auVar74._12_2_ >> 8 & 1) != 0) {
        pIVar40[(long)dVar55 + 0xd] = local_328 == dVar55;
      }
      auVar74 = auVar75 ^ auVar63;
      auVar95._0_4_ = -(uint)(iVar48 < auVar74._0_4_);
      auVar95._4_4_ = -(uint)(iVar54 < auVar74._4_4_);
      auVar95._8_4_ = -(uint)(iVar34 < auVar74._8_4_);
      auVar95._12_4_ = -(uint)(iVar47 < auVar74._12_4_);
      auVar110._4_4_ = auVar95._0_4_;
      auVar110._0_4_ = auVar95._0_4_;
      auVar110._8_4_ = auVar95._8_4_;
      auVar110._12_4_ = auVar95._8_4_;
      iVar48 = -(uint)(auVar74._4_4_ == iVar54);
      iVar54 = -(uint)(auVar74._12_4_ == iVar47);
      auVar97._4_4_ = iVar48;
      auVar97._0_4_ = iVar48;
      auVar97._8_4_ = iVar54;
      auVar97._12_4_ = iVar54;
      auVar71._4_4_ = auVar95._4_4_;
      auVar71._0_4_ = auVar95._4_4_;
      auVar71._8_4_ = auVar95._12_4_;
      auVar71._12_4_ = auVar95._12_4_;
      auVar71 = auVar97 & auVar110 | auVar71;
      auVar74 = packssdw(auVar71,auVar71);
      auVar14._8_4_ = 0xffffffff;
      auVar14._0_8_ = 0xffffffffffffffff;
      auVar14._12_4_ = 0xffffffff;
      auVar74 = packssdw(auVar74 ^ auVar14,auVar74 ^ auVar14);
      auVar74 = packsswb(auVar74,auVar74);
      if ((auVar74 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        pIVar40[(long)dVar55 + 0xe] = local_358 == dVar55;
      }
      auVar74 = pshufhw(auVar74,auVar110,0x84);
      in_XMM11 = pshufhw(auVar95,auVar97,0x84);
      in_XMM11 = in_XMM11 & auVar74;
      auVar29._4_4_ = auVar95._4_4_;
      auVar29._0_4_ = auVar95._4_4_;
      auVar29._8_4_ = auVar95._12_4_;
      auVar29._12_4_ = auVar95._12_4_;
      auVar74 = pshufhw(auVar74,auVar29,0x84);
      auVar72._8_4_ = 0xffffffff;
      auVar72._0_8_ = 0xffffffffffffffff;
      auVar72._12_4_ = 0xffffffff;
      auVar72 = (auVar74 | in_XMM11) ^ auVar72;
      auVar74 = packssdw(auVar72,auVar72);
      auVar74 = packsswb(auVar74,auVar74);
      if ((auVar74._14_2_ >> 8 & 1) != 0) {
        pIVar40[(long)dVar55 + 0xf] = (double)((long)dVar61 - 0xfU) == dVar55;
      }
      dVar55 = (double)((long)dVar55 + 0x10);
      lVar53 = (long)DAT_0011e070;
      lVar76 = auVar87._8_8_;
      auVar87._0_8_ = auVar87._0_8_ + lVar53;
      lVar73 = DAT_0011e070._8_8_;
      auVar87._8_8_ = lVar76 + lVar73;
      lVar76 = auVar86._8_8_;
      auVar86._0_8_ = auVar86._0_8_ + lVar53;
      auVar86._8_8_ = lVar76 + lVar73;
      lVar76 = auVar85._8_8_;
      auVar85._0_8_ = auVar85._0_8_ + lVar53;
      auVar85._8_8_ = lVar76 + lVar73;
      lVar76 = auVar83._8_8_;
      auVar83._0_8_ = auVar83._0_8_ + lVar53;
      auVar83._8_8_ = lVar76 + lVar73;
      lVar76 = auVar81._8_8_;
      auVar81._0_8_ = auVar81._0_8_ + lVar53;
      auVar81._8_8_ = lVar76 + lVar73;
      lVar76 = auVar80._8_8_;
      auVar80._0_8_ = auVar80._0_8_ + lVar53;
      auVar80._8_8_ = lVar76 + lVar73;
      lVar76 = auVar79._8_8_;
      auVar79._0_8_ = auVar79._0_8_ + lVar53;
      auVar79._8_8_ = lVar76 + lVar73;
      lVar76 = auVar75._8_8_;
      auVar75._0_8_ = auVar75._0_8_ + lVar53;
      auVar75._8_8_ = lVar76 + lVar73;
      auVar74 = _DAT_0011e070;
    } while ((double)(ulong)(local_308 + 0xfU & 0xfffffff0) != dVar55);
  }
LAB_0010de41:
  icetStateSetIntegerv(0x83,4,(IceTInt *)&local_378);
  icetStateSetDoublev(0x84,1,&local_248);
  icetStateSetDoublev(0x85,1,local_1b8);
  uVar50 = local_384;
  icetStateSetInteger(0x86,local_384);
  icetStateSetIntegerv(0x87,uVar50,(IceTInt *)contained_list);
  icetStateSetBooleanv(0x88,local_37c,pIVar40);
  icetGetEnumv(0x24,(IceTEnum *)local_138);
  if (local_138[0]._0_4_ != 0x6002) {
    icetGetIntegerv(3,(IceTInt *)&local_2c8);
    icetGetIntegerv(0x10,(IceTInt *)&local_248);
    pIVar40 = icetStateAllocateBoolean(0x89,(int)local_2c8 * local_248._0_4_);
    sendbuf = icetUnsafeStateGetBoolean(0x88);
    icetCommAllgather(sendbuf,local_248._0_4_,0x8001,pIVar40);
    pIVar39 = icetStateAllocateInteger(0x8a,local_248._0_4_);
    local_1b8[0] = (IceTDouble)((ulong)local_1b8[0] & 0xffffffff00000000);
    if (0 < (int)local_248._0_4_) {
      iVar48 = 0;
      lVar53 = 0;
      do {
        pIVar39[lVar53] = 0;
        iVar54 = 0;
        if (0 < (int)local_2c8) {
          iVar54 = 0;
          iVar34 = 0;
          do {
            if (pIVar40[(int)(local_248._0_4_ * iVar34 + (int)lVar53)] != '\0') {
              iVar54 = iVar54 + 1;
              pIVar39[lVar53] = iVar54;
            }
            iVar34 = iVar34 + 1;
          } while (iVar34 < (int)local_2c8);
        }
        iVar48 = iVar48 + iVar54;
        local_1b8[0] = (IceTDouble)CONCAT44(local_1b8[0]._4_4_,iVar48);
        lVar53 = lVar53 + 1;
      } while (lVar53 < (int)local_248._0_4_);
    }
    icetStateSetIntegerv(0x8b,1,(IceTInt *)local_1b8);
  }
  icetGetIntegerv(0x1b,(IceTInt *)&local_2c8);
  if ((int)local_2c8 < 0) {
    value = 0;
    iVar48 = -1;
  }
  else {
    pIVar39 = icetUnsafeStateGetInteger(0x11);
    value = pIVar39[(int)((int)local_2c8 * 4 | 3)] * pIVar39[(long)(int)local_2c8 * 4 + 2];
    iVar48 = (int)local_2c8;
  }
  icetStateSetInteger(0x8c,iVar48);
  icetStateSetInteger(0x8d,0);
  icetStateSetInteger(0x8e,value);
  icetGetPointerv(0x60,(IceTVoid **)&local_2c8);
  if (CONCAT44(local_2c8._4_4_,(int)local_2c8) == 0) {
    icetRaiseDiagnostic("Drawing function not set.  Call icetDrawCallback.",0xfffffffb,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/draw.c"
                        ,0x2ad);
    IVar38 = icetImageNull();
  }
  else {
    icetStateSetBoolean(0x80,'\x01');
    icetGetEnumv(0x24,(IceTEnum *)&local_248);
    IVar38 = icetInvokeStrategy(local_248._0_4_);
    icetStateSetBoolean(0x80,'\0');
    icetGetIntegerv(0x8c,(IceTInt *)local_138);
    icetGetIntegerv(0x1b,(IceTInt *)local_1b8);
    if (local_138[0]._0_4_ != local_1b8[0]._0_4_) {
      IVar33 = icetIsEnabled(0x146);
      if (IVar33 != '\0') {
        icetRaiseDiagnostic("Got unexpected tile from strategy.",0xffffffff,1,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/draw.c"
                            ,0x2bf);
      }
    }
    if (-1 < (int)local_138[0]._0_4_) {
      pIVar39 = icetUnsafeStateGetInteger(0x11);
      lVar53 = (long)(int)local_138[0]._0_4_;
      iVar48 = pIVar39[lVar53 * 4 + 2];
      IVar35 = icetImageGetWidth(IVar38);
      if ((iVar48 != IVar35) ||
         (iVar48 = pIVar39[lVar53 * 4 + 3], IVar35 = icetImageGetHeight(IVar38), iVar48 != IVar35))
      {
        icetGetIntegerv(0x8d,local_b8);
        icetGetIntegerv(0x8e,&local_308);
        icetRaiseDiagnostic("Got unexpected image size from strategy.",0xffffffff,1,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/draw.c"
                            ,0x2d2);
      }
    }
    icetStateCheckMemory();
  }
  if ((char)local_364 == '\0') {
    IVar35 = icetImageGetWidth(IVar38);
    IVar36 = icetImageGetHeight(IVar38);
    iVar48 = IVar36 * IVar35;
    IVar37 = icetImageGetColorFormat(IVar38);
    icetTimingBlendBegin();
    if (IVar37 == 0xc002) {
      pIVar45 = icetImageGetColorf(IVar38);
      if (0 < iVar48) {
        pfVar46 = (float *)(pIVar45 + 3);
        do {
          fVar77 = 1.0 - *pfVar46;
          pfVar46[-3] = (float)*background_color * fVar77 + pfVar46[-3];
          pfVar46[-2] = ((float *)background_color)[1] * fVar77 + pfVar46[-2];
          pfVar46[-1] = ((float *)background_color)[2] * fVar77 + pfVar46[-1];
          *pfVar46 = fVar77 * ((float *)background_color)[3] + *pfVar46;
          pfVar46 = pfVar46 + 4;
          iVar48 = iVar48 + -1;
        } while (iVar48 != 0);
      }
    }
    else if (IVar37 == 0xc001) {
      pIVar44 = icetImageGetColorub(IVar38);
      if (0 < iVar48) {
        lVar53 = 0;
        do {
          bVar4 = pIVar44[lVar53 * 4 + 3];
          uVar50 = bVar4 ^ 0xff;
          pIVar44[lVar53 * 4] = pIVar44[lVar53 * 4] + (char)((uVar50 * (local_31c & 0xff)) / 0xff);
          pIVar44[lVar53 * 4 + 1] =
               pIVar44[lVar53 * 4 + 1] + (char)((uVar50 * (local_320 & 0xff)) / 0xff);
          pIVar44[lVar53 * 4 + 2] =
               pIVar44[lVar53 * 4 + 2] + (char)((uVar50 * (local_34c & 0xff)) / 0xff);
          pIVar44[lVar53 * 4 + 3] =
               (char)((ulong)(uVar50 * (uVar58 & 0xff)) * 0x1010102 >> 0x20) + bVar4;
          lVar53 = lVar53 + 1;
        } while (iVar48 != (int)lVar53);
      }
    }
    else {
      icetRaiseDiagnostic("Encountered invalid color buffer type with color blending.",0xffffffff,1,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/draw.c"
                          ,0x2f3);
    }
    icetTimingBlendEnd();
  }
  icetGetDoublev(0xc1,(IceTDouble *)&local_2c8);
  icetGetDoublev(0xc2,&local_248);
  icetTimingDrawFrameEnd();
  icetGetDoublev(200,local_1b8);
  icetStateSetDouble(0xc6,(IceTDouble)
                          (((double)local_1b8[0] - (double)CONCAT44(local_2c8._4_4_,(int)local_2c8))
                          - (double)local_248));
  icetStateSetDouble(0xc3,0.0);
  icetStateCheckMemory();
  return (IceTImage)IVar38.opaque_internals;
}

Assistant:

IceTImage icetDrawFrame(const IceTDouble *projection_matrix,
                        const IceTDouble *modelview_matrix,
                        const IceTFloat *background_color)
{
    IceTInt frame_count;
    IceTImage image;
    IceTDouble render_time;
    IceTDouble buf_read_time;
    IceTDouble compose_time;
    IceTDouble total_time;
    IceTUInt background_color_word;
    IceTBoolean need_color_correction;

    icetRaiseDebug("In icetDrawFrame");

    {
        IceTBoolean isDrawing;
        icetGetBooleanv(ICET_IS_DRAWING_FRAME, &isDrawing);
        if (isDrawing) {
            icetRaiseError("Recursive frame draw detected.",
                           ICET_INVALID_OPERATION);
            return icetImageNull();
        }
    }

    icetStateResetTiming();
    icetTimingDrawFrameBegin();

    icetStateSetDoublev(ICET_PROJECTION_MATRIX, 16, projection_matrix);
    icetStateSetDoublev(ICET_MODELVIEW_MATRIX, 16, modelview_matrix);

    drawUseBackgroundColor(background_color,
                           &background_color_word,
                           &need_color_correction);

    icetGetIntegerv(ICET_FRAME_COUNT, &frame_count);
    frame_count++;
    icetStateSetIntegerv(ICET_FRAME_COUNT, 1, &frame_count);

    drawProjectBounds();

    {
        IceTEnum strategy;
        icetGetEnumv(ICET_STRATEGY, &strategy);

        /* drawCollectTileInformation does an allgather to get information
         * about the tiles in other processes.  These variables are
         * ICET_ALL_CONTAINED_TILES_MASKS, ICET_TILE_CONTRIB_COUNTS, and
         * ICET_TOTAL_IMAGE_COUNT.  However, the sequential strategy ignores
         * this information and just uses all processes for all tiles.  When
         * compositing a single tile, this is a fine strategy and we can save
         * a significant proportion of frame time by skipping this step. */
        if (strategy != ICET_STRATEGY_SEQUENTIAL) {
            drawCollectTileInformation();
        }
    }

    {
        IceTInt tile_displayed;
        icetGetIntegerv(ICET_TILE_DISPLAYED, &tile_displayed);

        if (tile_displayed >= 0) {
            const IceTInt *tile_viewports
                = icetUnsafeStateGetInteger(ICET_TILE_VIEWPORTS);
            IceTInt num_pixels = (  tile_viewports[4*tile_displayed+2]
                                  * tile_viewports[4*tile_displayed+3] );
            icetStateSetInteger(ICET_VALID_PIXELS_TILE, tile_displayed);
            icetStateSetInteger(ICET_VALID_PIXELS_OFFSET, 0);
            icetStateSetInteger(ICET_VALID_PIXELS_NUM, num_pixels);
        } else {
            icetStateSetInteger(ICET_VALID_PIXELS_TILE, -1);
            icetStateSetInteger(ICET_VALID_PIXELS_OFFSET, 0);
            icetStateSetInteger(ICET_VALID_PIXELS_NUM, 0);
        }
    }

    image = drawInvokeStrategy();

    /* Correct background color where applicable. */
    if (need_color_correction) {
        drawCorrectBackground(image, background_color, background_color_word);
    }

    /* Calculate times. */
    icetGetDoublev(ICET_RENDER_TIME, &render_time);
    icetGetDoublev(ICET_BUFFER_READ_TIME, &buf_read_time);

    icetTimingDrawFrameEnd();

    icetGetDoublev(ICET_TOTAL_DRAW_TIME, &total_time);

    compose_time = total_time - render_time - buf_read_time;
    icetStateSetDouble(ICET_COMPOSITE_TIME, compose_time);

    icetStateSetDouble(ICET_BUFFER_WRITE_TIME, 0.0);

    icetStateCheckMemory();

    return image;
}